

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O1

void lchange(int flag)

{
  mgwin *pmVar1;
  mgwin *pmVar2;
  buffer *pbVar3;
  mgwin *pmVar4;
  byte bVar5;
  byte bVar6;
  
  pbVar3 = curbp;
  bVar6 = (byte)flag;
  pmVar1 = curwp;
  pmVar2 = wheadp;
  if ((curbp->b_flag & 1U) == 0) {
    bVar6 = bVar6 | 0x10;
    curbp->b_flag = curbp->b_flag | 1;
    pmVar1 = curwp;
    pmVar2 = wheadp;
  }
  for (; pmVar4 = curwp, pmVar2 != (mgwin *)0x0; pmVar2 = (pmVar2->w_list).l_p.l_wp) {
    curwp = pmVar1;
    if (pmVar2->w_bufp == pbVar3) {
      bVar5 = pmVar2->w_rflag | bVar6;
      pmVar2->w_rflag = bVar5;
      if (pmVar2 != pmVar4) {
        pmVar2->w_rflag = bVar5 | 8;
      }
    }
    pmVar1 = curwp;
    curwp = pmVar4;
  }
  curwp = pmVar1;
  return;
}

Assistant:

void
lchange(int flag)
{
	struct mgwin	*wp;

	/* update mode lines if this is the first change. */
	if ((curbp->b_flag & BFCHG) == 0) {
		flag |= WFMODE;
		curbp->b_flag |= BFCHG;
	}
	for (wp = wheadp; wp != NULL; wp = wp->w_wndp) {
		if (wp->w_bufp == curbp) {
			wp->w_rflag |= flag;
			if (wp != curwp)
				wp->w_rflag |= WFFULL;
		}
	}
}